

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::update(Model *this,vector<int,_std::allocator<int>_> *input,int32_t target,real lr)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  element_type *peVar4;
  const_iterator this_00;
  const_iterator vec;
  int in_EDX;
  Model *in_RSI;
  Model *in_RDI;
  real in_XMM0_Da;
  real rVar5;
  undefined1 auVar6 [16];
  const_iterator it;
  element_type *in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  Vector *in_stack_ffffffffffffffc8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffe0;
  
  if (in_EDX < 0) {
    __assert_fail("target >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                  ,0xb2,"void fasttext::Model::update(const std::vector<int32_t> &, int32_t, real)")
    ;
  }
  if (in_RDI->osz_ <= in_EDX) {
    __assert_fail("target < osz_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                  ,0xb3,"void fasttext::Model::update(const std::vector<int32_t> &, int32_t, real)")
    ;
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)in_RSI);
  if (sVar3 != 0) {
    computeHidden(in_RSI,(vector<int,_std::allocator<int>_> *)CONCAT44(in_EDX,in_XMM0_Da),
                  (Vector *)in_stack_ffffffffffffffe0._M_current);
    peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x162382);
    if (peVar4->loss == ns) {
      rVar5 = negativeSampling(in_RDI,(int32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                               SUB84(in_stack_ffffffffffffffc8,0));
      fVar1 = rVar5 + in_RDI->loss_;
      in_RDI->loss_ = fVar1;
    }
    else {
      peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1623be);
      if (peVar4->loss == hs) {
        rVar5 = hierarchicalSoftmax(in_RSI,in_EDX,in_XMM0_Da);
        fVar1 = rVar5 + in_RDI->loss_;
        in_RDI->loss_ = fVar1;
      }
      else {
        rVar5 = softmax(in_RSI,in_EDX,in_XMM0_Da);
        fVar1 = rVar5 + in_RDI->loss_;
        in_RDI->loss_ = fVar1;
      }
    }
    auVar6 = ZEXT416((uint)fVar1);
    in_RDI->nexamples_ = in_RDI->nexamples_ + 1;
    peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16242b);
    if (peVar4->model == sup) {
      in_stack_ffffffffffffffc8 = &in_RDI->grad_;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)in_RSI);
      auVar6 = vcvtusi2sd_avx512f(auVar6,sVar3);
      Vector::mul(in_stack_ffffffffffffffc8,(float)(1.0 / auVar6._0_8_));
    }
    this_00 = std::vector<int,_std::allocator<int>_>::cbegin
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb8);
    while( true ) {
      vec = std::vector<int,_std::allocator<int>_>::cend
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb8);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffc0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffb8);
      if (!bVar2) break;
      in_stack_ffffffffffffffb8 =
           std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1624a9);
      in_stack_ffffffffffffffc0 = &in_RDI->grad_;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
      Matrix::addRow((Matrix *)this_00._M_current,(Vector *)vec._M_current,(int64_t)in_RDI,
                     (real)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void Model::update(const std::vector<int32_t>& input, int32_t target, real lr) {
  assert(target >= 0);
  assert(target < osz_);
  if (input.size() == 0) return;
  computeHidden(input, hidden_);
  if (args_->loss == loss_name::ns) {
    loss_ += negativeSampling(target, lr);
  } else if (args_->loss == loss_name::hs) {
    loss_ += hierarchicalSoftmax(target, lr);
  } else {
    loss_ += softmax(target, lr);
  }
  nexamples_ += 1;

  if (args_->model == model_name::sup) {
    grad_.mul(1.0 / input.size());
  }
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    wi_->addRow(grad_, *it, 1.0);
  }
}